

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeTest(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  uint *puVar1;
  Status stat;
  pointer pnVar2;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_58;
  
  stat = ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thedesc.stat)->data[i];
  if (this->theRep * stat < 1) {
    test(&local_58,this,i,stat);
    pnVar2 = (this->theTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &pnVar2[i].m_backend;
    *(undefined8 *)((long)&pnVar2[i].m_backend.data + 0x20) =
         local_58.m_backend.data._M_elems._32_8_;
    puVar1 = (uint *)((long)&pnVar2[i].m_backend.data + 0x10);
    *(undefined8 *)puVar1 = local_58.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_58.m_backend.data._M_elems._24_8_;
    *(undefined8 *)&pnVar2[i].m_backend.data = local_58.m_backend.data._M_elems._0_8_;
    *(undefined8 *)((long)&pnVar2[i].m_backend.data + 8) = local_58.m_backend.data._M_elems._8_8_;
    pnVar2[i].m_backend.exp = local_58.m_backend.exp;
    pnVar2[i].m_backend.neg = local_58.m_backend.neg;
    pnVar2[i].m_backend.fpclass = local_58.m_backend.fpclass;
    pnVar2[i].m_backend.prec_elem = local_58.m_backend.prec_elem;
  }
  else {
    this_00 = &(this->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(this_00,0);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&__return_storage_ptr__->m_backend,this_00);
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::computeTest(int i)
{
   typename SPxBasisBase<R>::Desc::Status stat = this->desc().status(i);

   if(isBasic(stat))
      return theTest[i] = 0;
   else
      return theTest[i] = test(i, stat);
}